

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block.cc
# Opt level: O2

bool __thiscall
leveldb::FilterBlockReader::KeyMayMatch(FilterBlockReader *this,uint64_t block_offset,Slice *key)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  int iVar4;
  ulong uVar5;
  Slice filter;
  char *local_10;
  ulong local_8;
  
  uVar5 = block_offset >> ((byte)this->base_lg_ & 0x3f);
  if (uVar5 < this->num_) {
    pcVar3 = this->offset_;
    uVar1 = *(uint *)(pcVar3 + uVar5 * 4);
    uVar2 = *(uint *)(pcVar3 + uVar5 * 4 + 4);
    if (uVar1 <= uVar2) {
      if ((ulong)uVar2 <= (ulong)((long)pcVar3 - (long)this->data_)) {
        local_10 = this->data_ + uVar1;
        local_8 = (ulong)(uVar2 - uVar1);
        iVar4 = (*this->policy_->_vptr_FilterPolicy[4])(this->policy_,key,&local_10);
        return SUB41(iVar4,0);
      }
    }
    if (uVar1 == uVar2) {
      return false;
    }
  }
  return true;
}

Assistant:

bool FilterBlockReader::KeyMayMatch(uint64_t block_offset, const Slice& key) {
  uint64_t index = block_offset >> base_lg_;
  if (index < num_) {
    uint32_t start = DecodeFixed32(offset_ + index * 4);
    uint32_t limit = DecodeFixed32(offset_ + index * 4 + 4);
    if (start <= limit && limit <= static_cast<size_t>(offset_ - data_)) {
      Slice filter = Slice(data_ + start, limit - start);
      return policy_->KeyMayMatch(key, filter);
    } else if (start == limit) {
      // Empty filters do not match any keys
      return false;
    }
  }
  return true;  // Errors are treated as potential matches
}